

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O1

void DLevelScript::ReplaceTextures(int fromnamei,int tonamei,int flags)

{
  int iVar1;
  sector_t *psVar2;
  FTextureID FVar3;
  FTextureID FVar4;
  char *name;
  char *name_00;
  FTextureID *pFVar5;
  long lVar6;
  FTextureID *pFVar7;
  int j;
  long lVar8;
  
  name = FBehavior::StaticLookupString(fromnamei);
  name_00 = FBehavior::StaticLookupString(tonamei);
  if (name != (char *)0x0) {
    if (flags != 7) {
      FVar3 = FTextureManager::GetTexture(&TexMan,name,1,2);
      FVar4 = FTextureManager::GetTexture(&TexMan,name_00,1,2);
      if (0 < numsides) {
        pFVar5 = &sides->textures[0].texture;
        lVar6 = 0;
        do {
          lVar8 = 0;
          pFVar7 = pFVar5;
          do {
            if ((((uint)"\x04\x02\x01"[lVar8] & flags) == 0) && (pFVar7->texnum == FVar3.texnum)) {
              pFVar7->texnum = FVar4.texnum;
            }
            lVar8 = lVar8 + 1;
            pFVar7 = pFVar7 + 0xc;
          } while (lVar8 != 3);
          lVar6 = lVar6 + 1;
          pFVar5 = pFVar5 + 0x36;
        } while (lVar6 < numsides);
      }
      if (flags == 0x18) {
        return;
      }
    }
    FVar3 = FTextureManager::GetTexture(&TexMan,name,2,2);
    FVar4 = FTextureManager::GetTexture(&TexMan,name_00,2,2);
    if (0 < numsectors) {
      lVar6 = 0;
      lVar8 = 0;
      do {
        psVar2 = sectors;
        if ((((flags & 8U) == 0) &&
            (iVar1 = *(int *)((long)&sectors->planes[0].Texture.texnum + lVar6),
            iVar1 == FVar3.texnum)) &&
           (*(int *)((long)&sectors->planes[0].Texture.texnum + lVar6) = FVar4.texnum,
           iVar1 != FVar4.texnum)) {
          sector_t::AdjustFloorClip((sector_t *)((long)&psVar2->planes[0].xform.xOffs + lVar6));
        }
        if (((flags & 0x10U) == 0) &&
           (*(int *)((long)&psVar2->planes[1].Texture.texnum + lVar6) == FVar3.texnum)) {
          *(int *)((long)&psVar2->planes[1].Texture.texnum + lVar6) = FVar4.texnum;
        }
        lVar8 = lVar8 + 1;
        lVar6 = lVar6 + 0x268;
      } while (lVar8 < numsectors);
    }
  }
  return;
}

Assistant:

void DLevelScript::ReplaceTextures (int fromnamei, int tonamei, int flags)
{
	const char *fromname = FBehavior::StaticLookupString (fromnamei);
	const char *toname = FBehavior::StaticLookupString (tonamei);
	FTextureID picnum1, picnum2;

	if (fromname == NULL)
		return;

	if ((flags ^ (NOT_BOTTOM | NOT_MIDDLE | NOT_TOP)) != 0)
	{
		picnum1 = TexMan.GetTexture (fromname, FTexture::TEX_Wall, FTextureManager::TEXMAN_Overridable);
		picnum2 = TexMan.GetTexture (toname, FTexture::TEX_Wall, FTextureManager::TEXMAN_Overridable);

		for (int i = 0; i < numsides; ++i)
		{
			side_t *wal = &sides[i];

			for(int j=0;j<3;j++)
			{
				static BYTE bits[]={NOT_TOP, NOT_MIDDLE, NOT_BOTTOM};
				if (!(flags & bits[j]) && wal->GetTexture(j) == picnum1)
				{
					wal->SetTexture(j, picnum2);
				}
			}
		}
	}
	if ((flags ^ (NOT_FLOOR | NOT_CEILING)) != 0)
	{
		picnum1 = TexMan.GetTexture (fromname, FTexture::TEX_Flat, FTextureManager::TEXMAN_Overridable);
		picnum2 = TexMan.GetTexture (toname, FTexture::TEX_Flat, FTextureManager::TEXMAN_Overridable);

		for (int i = 0; i < numsectors; ++i)
		{
			sector_t *sec = &sectors[i];

			if (!(flags & NOT_FLOOR) && sec->GetTexture(sector_t::floor) == picnum1) 
				sec->SetTexture(sector_t::floor, picnum2);
			if (!(flags & NOT_CEILING) && sec->GetTexture(sector_t::ceiling) == picnum1)	
				sec->SetTexture(sector_t::ceiling, picnum2);
		}
	}
}